

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O1

int __thiscall
bhf::ads::SymbolAccess::Write<unsigned_short>(SymbolAccess *this,SymbolEntry *entry,string *v)

{
  long lVar1;
  code *pcVar2;
  ostream *poVar3;
  int iVar4;
  stringstream converter;
  stringstream stream_1;
  undefined2 local_35a;
  string local_358;
  long local_338 [2];
  long local_328 [2];
  byte abStack_318 [96];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [128];
  ios_base local_130 [264];
  
  if (v->_M_string_length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_338);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"Write",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"<T>() empty strings are not supported\n",0x26);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)local_1b0);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
    iVar4 = 0x706;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char *)v,0x12f671,0);
    std::__cxx11::stringstream::stringstream((stringstream *)local_338);
    if (lVar1 == -1) {
      pcVar2 = std::dec;
    }
    else {
      pcVar2 = std::hex;
    }
    (*pcVar2)((ostream *)local_328 + *(long *)(local_328[0] + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,(v->_M_dataplus)._M_p,v->_M_string_length);
    local_35a = 0;
    std::istream::_M_extract<unsigned_short>((ushort *)local_338);
    if ((abStack_318[*(long *)(local_338[0] + -0x18)] & 5) == 0) {
      lVar1 = AdsDevice::WriteReqEx
                        (&this->device,(entry->header).iGroup,(entry->header).iOffs,2,&local_35a);
      iVar4 = (int)lVar1;
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      poVar3 = (ostream *)(local_1b0 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Write",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"() parsing \'",0xc);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(v->_M_dataplus)._M_p,v->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' failed\n",9);
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
      std::ios_base::~ios_base(local_130);
      iVar4 = 0x706;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
  }
  return iVar4;
}

Assistant:

int SymbolAccess::Write(const SymbolEntry& entry, const std::string& v) const
{
    if (!v.size()) {
        LOG_ERROR(__FUNCTION__ << "<T>() empty strings are not supported\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }

    const auto asHex = (v.npos != v.rfind("0x", 0));
    std::stringstream converter;
    converter << (asHex ? std::hex : std::dec) << v;

    T value = {};
    converter >> value;
    if (converter.fail()) {
        LOG_ERROR(__FUNCTION__ << "() parsing '" << v << "' failed\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }

    value = bhf::ads::htole(value);
    return device.WriteReqEx(entry.header.iGroup,
                             entry.header.iOffs,
                             sizeof(value),
                             &value);
}